

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

void __thiscall
tsbp::LeftmostActiveOnly::DeactivatePlacement(LeftmostActiveOnly *this,Node *node,size_t nodeId)

{
  double *pdVar1;
  int iVar2;
  Rectangle *pRVar3;
  pointer psVar4;
  size_t sVar5;
  bool bVar6;
  size_type sVar7;
  reference pvVar8;
  int *piVar9;
  Rectangle *pRVar10;
  reference pvVar11;
  __tuple_element_t<0UL,_tuple<unsigned_long,_unsigned_long>_> *p_Var12;
  __tuple_element_t<1UL,_tuple<unsigned_long,_unsigned_long>_> *p_Var13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  value_type local_150;
  type_conflict2 *newActiveY;
  type_conflict2 *newActiveX;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  size_t local_f0;
  size_t coveredHorizontalBarAtY;
  size_t deactivatedHorizontalBarAtY;
  size_t placedAreaHorizontalBarAtY;
  size_t y_1;
  size_t updatedInfeasiblePlacementPoints;
  size_t oldInfeasiblePlacementPoints;
  double updatedCoveredArea;
  double oldCoveredArea;
  size_t maxY;
  reference local_98;
  Rectangle *item;
  size_t i;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *placedItems;
  int iStack_78;
  bool infeasibleFixedSequence;
  int minItemDy;
  pointer local_70;
  size_t disabledDx;
  size_t xAtMinY;
  size_t previousX;
  size_t x;
  size_t y;
  size_t aboveMinY;
  int local_30;
  int local_2c;
  int placementY;
  int placementX;
  Packing2D *packing;
  size_t nodeId_local;
  Node *node_local;
  LeftmostActiveOnly *this_local;
  
  (node->super_BaseNode).NodeStatus = DeactivatedPlacement;
  packing = (Packing2D *)nodeId;
  nodeId_local = (size_t)node;
  node_local = (Node *)this;
  _placementY = std::unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>::operator*
                          (&node->Packing);
  local_2c = ((type)_placementY)->ActiveX;
  local_30 = ((type)_placementY)->ActiveY;
  if ((local_30 == 0) && (local_2c == ((type)_placementY)->MaxX)) {
    std::
    unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
    ::emplace<unsigned_long&>
              ((unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
                *)&this->nodesToDeactivate,(unsigned_long *)&packing);
    *(undefined4 *)(nodeId_local + 8) = 6;
  }
  else {
    sVar7 = CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      (&((type)_placementY)->PlacedAreaVector);
    y = sVar7 - 1;
    for (x = (size_t)local_30; sVar5 = x,
        sVar7 = CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           (_placementY + 0x50)), sVar5 < sVar7 - 1; x = x + 1) {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          (_placementY + 0x50),x);
      previousX = *pvVar8;
      if ((ulong)(long)local_2c < previousX) {
        y = x;
        break;
      }
    }
    if (local_30 == 0) {
      local_150 = (value_type)(this->container).super_Rectangle.Dx;
    }
    else {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          (_placementY + 0x50),(long)(local_30 + -1));
      local_150 = *pvVar8;
    }
    sVar5 = y;
    xAtMinY = local_150;
    disabledDx = local_150;
    sVar7 = CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(_placementY + 0x50)
                      );
    if (sVar5 < sVar7 - 1) {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          (_placementY + 0x50),y);
      disabledDx = *pvVar8;
    }
    minItemDy = (int)disabledDx;
    iStack_78 = (int)xAtMinY;
    piVar9 = CLI::std::min<int>(&minItemDy,&stack0xffffffffffffff88);
    local_70 = (pointer)(long)*piVar9;
    placedItems._4_4_ = (this->container).super_Rectangle.Dy;
    placedItems._3_1_ = 0;
    i = _placementY + 0x18;
    for (item = (Rectangle *)0x0; pRVar3 = item,
        pRVar10 = (Rectangle *)
                  CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::size
                            (&this->items), pRVar3 < pRVar10;
        item = (Rectangle *)((long)&item->X + 1)) {
      local_98 = std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::operator[]
                           ((vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)
                            &this->items,(size_type)item);
      bVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)i,
                         (size_type)item);
      if (!bVar6) {
        if (((this->areItemCoordinatesFixedX & 1U) != 0) &&
           (pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                (&this->fixedItemCoordinatesX,(size_type)item),
           (ulong)(long)*pvVar11 < *(size_t *)(_placementY + 8))) {
          std::
          unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
          ::emplace<unsigned_long&>
                    ((unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
                      *)&this->nodesToDeactivate,(unsigned_long *)&packing);
          *(undefined4 *)(nodeId_local + 8) = 6;
          return;
        }
        piVar9 = CLI::std::min<int>((int *)((long)&placedItems + 4),&local_98->Dy);
        placedItems._4_4_ = *piVar9;
      }
    }
    oldCoveredArea = (double)(long)(local_30 + 1);
    if (y - (long)local_30 < (ulong)(long)placedItems._4_4_) {
      oldCoveredArea = (double)y;
    }
    updatedCoveredArea = 0.0;
    oldInfeasiblePlacementPoints = 0;
    updatedInfeasiblePlacementPoints = 0;
    y_1 = 0;
    for (placedAreaHorizontalBarAtY = (size_t)local_30;
        placedAreaHorizontalBarAtY < (ulong)oldCoveredArea;
        placedAreaHorizontalBarAtY = placedAreaHorizontalBarAtY + 1) {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          (_placementY + 0x50),placedAreaHorizontalBarAtY);
      deactivatedHorizontalBarAtY = *pvVar8;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          (_placementY + 0x68),placedAreaHorizontalBarAtY);
      coveredHorizontalBarAtY = *pvVar8;
      local_f4 = (int)deactivatedHorizontalBarAtY;
      local_f8 = (int)coveredHorizontalBarAtY;
      piVar9 = CLI::std::max<int>(&local_f4,&local_f8);
      iVar2 = *piVar9;
      local_f0 = (size_t)iVar2;
      auVar17._8_4_ = iVar2 >> 0x1f;
      auVar17._0_8_ = local_f0;
      auVar17._12_4_ = 0x45300000;
      updatedCoveredArea =
           updatedCoveredArea +
           (auVar17._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0);
      auVar16._8_4_ = (int)((ulong)local_70 >> 0x20);
      auVar16._0_8_ = local_70;
      auVar16._12_4_ = 0x45300000;
      oldInfeasiblePlacementPoints =
           (size_t)((auVar16._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)local_70) - 4503599627370496.0) +
                   (double)oldInfeasiblePlacementPoints);
      if (placedAreaHorizontalBarAtY <= this->reducedItemDomainY) {
        local_100 = (int)this->reducedItemDomainX + 1;
        local_fc = iVar2;
        piVar9 = CLI::std::min<int>(&local_fc,&local_100);
        updatedInfeasiblePlacementPoints = (long)*piVar9 + updatedInfeasiblePlacementPoints;
        local_104 = (int)local_70;
        local_108 = (int)this->reducedItemDomainX + 1;
        piVar9 = CLI::std::min<int>(&local_104,&local_108);
        y_1 = (long)*piVar9 + y_1;
      }
      psVar4 = local_70;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          (_placementY + 0x68),placedAreaHorizontalBarAtY);
      *pvVar8 = (value_type)psVar4;
    }
    *(double *)(_placementY + 0x80) =
         ((double)oldInfeasiblePlacementPoints - updatedCoveredArea) +
         *(double *)(_placementY + 0x80);
    *(size_t *)(_placementY + 0x90) =
         (y_1 - updatedInfeasiblePlacementPoints) + *(size_t *)(_placementY + 0x90);
    dVar15 = *(double *)(_placementY + 0x88);
    dVar14 = Packing2D::GetDeactivatedArea((Packing2D *)_placementY);
    dVar15 = dVar15 + dVar14;
    pdVar1 = &(this->container).super_Rectangle.Area;
    if (((*pdVar1 <= dVar15 && dVar15 != *pdVar1) ||
        (((*(bool *)(_placementY + 0x98) & 1U) == 0 &&
         (this->reducedItemFeasiblePlacementPoints <= *(size_t *)(_placementY + 0x90))))) ||
       ((bVar6 = std::optional<int>::has_value(&this->fixedItemAtOrigin), bVar6 &&
        ((*(bool *)(_placementY + 0x99) & 1U) == 0)))) {
      std::
      unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
      ::emplace<unsigned_long&>
                ((unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
                  *)&this->nodesToDeactivate,(unsigned_long *)&packing);
      *(undefined4 *)(nodeId_local + 8) = 6;
    }
    else {
      FindNewBottomLeft((LeftmostActiveOnly *)&newActiveX,(Packing2D *)this);
      p_Var12 = std::get<0ul,unsigned_long,unsigned_long>
                          ((tuple<unsigned_long,_unsigned_long> *)&newActiveX);
      p_Var13 = std::get<1ul,unsigned_long,unsigned_long>
                          ((tuple<unsigned_long,_unsigned_long> *)&newActiveX);
      *(int *)_placementY = (int)*p_Var12;
      *(int *)(_placementY + 4) = (int)*p_Var13;
    }
  }
  return;
}

Assistant:

void LeftmostActiveOnly::DeactivatePlacement(Node& node, size_t nodeId)
{
    ////Node& node = this->tree[nodeId];
    node.NodeStatus = BaseNode::Status::DeactivatedPlacement;

    Packing2D& packing = *node.Packing;

    int placementX = packing.ActiveX;
    int placementY = packing.ActiveY;

    if (placementY == 0 && placementX == packing.MaxX)
    {
        this->nodesToDeactivate.emplace(nodeId);

        node.NodeStatus = BaseNode::Status::InfeasibleSequence;
        return;
    }

    // Determine the closest item above the current placement point. The east edge of the item is one of two bounds on the maximum x coordinate of the dummy item.
    size_t aboveMinY = packing.PlacedAreaVector.size() - 1; // TODO.Performance: - minDy
    for (size_t y = placementY; y < packing.PlacedAreaVector.size() - 1; y++)
    {
        size_t x = packing.PlacedAreaVector[y];
        ////assert(packing.Layout.DeactivatedAreaVector[y] < placementX);

        if (x > placementX)
        {
            aboveMinY = y;
            break;
        }
    }

    // Determine the other bound for the maximum x coordinate of the dummy item, i.e. the closest item below the current one.
    size_t previousX = placementY == 0 ? this->container.Dx : packing.PlacedAreaVector[placementY - 1];
    size_t xAtMinY = previousX;

    if (aboveMinY < packing.PlacedAreaVector.size() - 1)
    {
        xAtMinY = packing.PlacedAreaVector[aboveMinY];
    }

    // The maximum x coordinate of the dummy item.
    size_t disabledDx = std::min<int>(xAtMinY, previousX);

    // Determine maximum item.Dy to disable the maximum area possible.
    int minItemDy = container.Dy;
    bool infeasibleFixedSequence = false;
    const auto& placedItems = packing.PlacedItems;

    for (size_t i = 0; i < this->items.size(); i++)
    {
        const Rectangle& item = this->items[i];

        if (placedItems[i])
        {
            continue;
        }

        if (this->areItemCoordinatesFixedX
            ////&& !placedItems[i]
            && this->fixedItemCoordinatesX[i] < packing.MinX)
        {
            // Must be compared against MinX because after placing the current item, a new placement point might be generated with x < newActiveX, e.g. inverted L-shape.
            // Can be improved by accounting for item.Dy but requires more complicated checks.
            this->nodesToDeactivate.emplace(nodeId);
            node.NodeStatus = BaseNode::Status::InfeasibleSequence;
            return;
        }

        minItemDy = std::min<int>(minItemDy, item.Dy);
    }

    size_t maxY = placementY + 1;
    if (minItemDy > aboveMinY - placementY)
    {
        maxY = aboveMinY;
    }

    // Deactivate complete area between the two neighboring items.
    // Complete area between items (or the top of the bin) can only be deactivated if the distance to the item above (aboveMinY - placementY) is smaller than the smallest remaining item.
    // Otherwise, it cannot because feasible solutions might be excluded. Only one horizontal bar (disabledDx) at placementY can be deactivated.
    double oldCoveredArea = 0.0;
    double updatedCoveredArea = 0.0;
    size_t oldInfeasiblePlacementPoints = 0;
    size_t updatedInfeasiblePlacementPoints = 0;
    for (size_t y = placementY; y < maxY; y++)
    ////for (size_t y = placementY; y < aboveMinY; y++)
    {
        size_t placedAreaHorizontalBarAtY = packing.PlacedAreaVector[y];
        size_t deactivatedHorizontalBarAtY = packing.DeactivatedAreaVector[y];

        size_t coveredHorizontalBarAtY = std::max<int>(placedAreaHorizontalBarAtY, deactivatedHorizontalBarAtY);

        oldCoveredArea += coveredHorizontalBarAtY;
        updatedCoveredArea += disabledDx;

        if (y <= this->reducedItemDomainY)
        {
            oldInfeasiblePlacementPoints += std::min<int>(coveredHorizontalBarAtY, this->reducedItemDomainX + 1);
            updatedInfeasiblePlacementPoints += std::min<int>(disabledDx, this->reducedItemDomainX + 1);
        }

        packing.DeactivatedAreaVector[y] = disabledDx;
    }

    packing.DeactivatedArea += (updatedCoveredArea - oldCoveredArea);
    packing.ReducedItemInfeasiblePlacementPoints += (updatedInfeasiblePlacementPoints - oldInfeasiblePlacementPoints);

    if (packing.RemainingItemAreaToPlace + packing.GetDeactivatedArea() > this->container.Area
        || (!packing.IsReducedItemPlaced && packing.ReducedItemInfeasiblePlacementPoints >= this->reducedItemFeasiblePlacementPoints)
        || fixedItemAtOrigin.has_value() && !packing.IsFixedItemPlaced)
    {
        nodesToDeactivate.emplace(nodeId);

        node.NodeStatus = BaseNode::Status::InfeasibleSequence;
        return;
    }

    // Determine new active coordinates.
    auto [newActiveX, newActiveY] = FindNewBottomLeft(packing);

    packing.ActiveX = newActiveX;
    packing.ActiveY = newActiveY;

    /*
    // Snippet for managing deactivated area with boost::geometry. Worse performance than the current solution.
    // Deprecated.Logic: account for case when activeX = binDx
    if (packing.ActiveY == 0)
    {
        // TODO.Logic: add correct deactivated area.
        return node.NodeStatus;
    }

    // TODO.Logic: must this not be before if (packing.ActiveY) ?
    packing.ActiveX = packing.BackupX;
    packing.ActiveY = packing.BackupY;

    // Add dummy item of height 1.
    const Rectangle& previouslyPlacedItem = packing.Layout.Items.back();

    // Update deactivated area. Use https://www.boost.org/doc/libs/1_76_0/libs/geometry/doc/html/geometry/reference/algorithms/union_/union__3.html
    using boost::assign::tuple_list_of;
    using boost::make_tuple;
    using bg::append;

    ////typedef bg::model::polygon<bg::model::d2::point_xy<double> > polygon;
    ////typedef bg::model::polygon<boost::tuple<int, int> > polygon;

    // Deactivate the area to the left.
    Polygon newItemDummy;
    append(newItemDummy, tuple_list_of(previouslyPlacedItem.X, previouslyPlacedItem.Y)(previouslyPlacedItem.X, previouslyPlacedItem.Y + previouslyPlacedItem.Dy + 1)(previouslyPlacedItem.X + previouslyPlacedItem.Dx, previouslyPlacedItem.Y + previouslyPlacedItem.Dy + 1)(previouslyPlacedItem.X + previouslyPlacedItem.Dx, previouslyPlacedItem.Y)(previouslyPlacedItem.X, previouslyPlacedItem.Y));

    std::vector<Polygon> output;
    bg::union_(packing.Layout.DeactivatedArea, newItemDummy, output);

    ////for (const auto& p : output)
    ////{
    ////    std::cout << "Covered area = " << bg::area(p) << "\n";
    ////}

    // For MiM, output.size() > 1 can occur.
    packing.Layout.DeactivatedArea = output.front();

    return node.NodeStatus;
    */
}